

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_vmstd.hpp
# Opt level: O2

void __thiscall squall::VMStd::dofile(VMStd *this,SQChar *filename)

{
  SQRESULT SVar1;
  squirrel_error *this_00;
  keeper k;
  
  k.vm = (this->super_VM).imp_.vm_;
  k.top = sq_gettop(k.vm);
  sq_pushroottable((this->super_VM).imp_.vm_);
  SVar1 = sqstd_dofile((this->super_VM).imp_.vm_,filename,0,1);
  if (-1 < SVar1) {
    keeper::~keeper(&k);
    return;
  }
  this_00 = (squirrel_error *)__cxa_allocate_exception(0x10);
  squirrel_error::runtime_error(this_00,"dofile failed");
  __cxa_throw(this_00,&squirrel_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void dofile(const SQChar* filename) {
        keeper k(handle());
        sq_pushroottable(handle());
        if (!SQ_SUCCEEDED(sqstd_dofile(handle(), filename, 0, 1))) {
            throw squirrel_error("dofile failed");
        }
    }